

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuilderTask.cpp
# Opt level: O0

void __thiscall
nigel::BuilderTask::printErrorLog
          (BuilderTask *this,
          list<std::shared_ptr<nigel::CompileNotification>,_std::allocator<std::shared_ptr<nigel::CompileNotification>_>_>
          *notificationList,
          time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
          startTime)

{
  ulong uVar1;
  bool bVar2;
  element_type *peVar3;
  element_type *this_00;
  string *__lhs;
  u64 __val;
  mapped_type *__rhs;
  element_type *peVar4;
  element_type *peVar5;
  long lVar6;
  ulong uVar7;
  char *pcVar8;
  double extraout_XMM0_Qa;
  double __x;
  rep_conflict rVar9;
  double __x_00;
  double __x_01;
  double __x_02;
  bool local_70b;
  string local_6c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_688;
  string local_668;
  string local_648;
  string local_628;
  string local_608;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_588;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_568;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_548;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_528;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_508;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4c8;
  string local_4a8;
  string local_488;
  string local_468;
  string local_448;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_428;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_408;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_388;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_368;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_348;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_328;
  string local_308 [32];
  ulong local_2e8;
  size_t i_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b8;
  ulong local_298;
  size_t i;
  size_t local_270;
  size_t pos;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  string local_208;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  string local_168;
  string local_148;
  string local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  __shared_ptr_access<nigel::CompileNotification,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *local_a8;
  shared_ptr<nigel::CompileNotification> *n;
  iterator __end1;
  iterator __begin1;
  list<std::shared_ptr<nigel::CompileNotification>,_std::allocator<std::shared_ptr<nigel::CompileNotification>_>_>
  *__range1;
  duration<double,_std::ratio<1L,_1L>_> local_80;
  duration<double,_std::ratio<1L,_1L>_> duration;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  endTime;
  LogLevel level;
  allocator local_59;
  string local_58 [8];
  String outStr;
  size_t notificationCount;
  size_t warningCount;
  size_t errorCount;
  list<std::shared_ptr<nigel::CompileNotification>,_std::allocator<std::shared_ptr<nigel::CompileNotification>_>_>
  *notificationList_local;
  BuilderTask *this_local;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  startTime_local;
  
  warningCount = 0;
  notificationCount = 0;
  outStr.field_2._8_8_ = 0;
  this_local = (BuilderTask *)startTime.__d.__r;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_58,"",&local_59);
  std::allocator<char>::~allocator((allocator<char> *)&local_59);
  duration.__r = (rep_conflict)std::chrono::_V2::system_clock::now();
  __range1 = (list<std::shared_ptr<nigel::CompileNotification>,_std::allocator<std::shared_ptr<nigel::CompileNotification>_>_>
              *)std::chrono::operator-
                          ((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                            *)&duration,
                           (time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                            *)&this_local);
  std::chrono::duration<double,std::ratio<1l,1l>>::duration<long,std::ratio<1l,1000000000l>,void>
            ((duration<double,std::ratio<1l,1l>> *)&local_80,
             (duration<long,_std::ratio<1L,_1000000000L>_> *)&__range1);
  __end1 = std::__cxx11::
           list<std::shared_ptr<nigel::CompileNotification>,_std::allocator<std::shared_ptr<nigel::CompileNotification>_>_>
           ::begin(notificationList);
  n = (shared_ptr<nigel::CompileNotification> *)
      std::__cxx11::
      list<std::shared_ptr<nigel::CompileNotification>,_std::allocator<std::shared_ptr<nigel::CompileNotification>_>_>
      ::end(notificationList);
  while (bVar2 = std::operator!=(&__end1,(_Self *)&n), bVar2) {
    local_a8 = (__shared_ptr_access<nigel::CompileNotification,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)std::_List_iterator<std::shared_ptr<nigel::CompileNotification>_>::operator*
                            (&__end1);
    peVar3 = std::
             __shared_ptr_access<nigel::CompileNotification,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->(local_a8);
    this_00 = std::
              __shared_ptr_access<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)&peVar3->file);
    __lhs = boost::filesystem::path::generic_string_abi_cxx11_(this_00);
    std::operator+(&local_c8,__lhs,"(");
    std::__cxx11::string::operator=(local_58,(string *)&local_c8);
    std::__cxx11::string::~string((string *)&local_c8);
    peVar3 = std::
             __shared_ptr_access<nigel::CompileNotification,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->(local_a8);
    bVar2 = std::operator!=(&peVar3->token,(nullptr_t)0x0);
    if (bVar2) {
      peVar3 = std::
               __shared_ptr_access<nigel::CompileNotification,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->(local_a8);
      peVar5 = std::__shared_ptr_access<nigel::Token,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<nigel::Token,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&peVar3->token);
      std::__cxx11::to_string(&local_128,peVar5->lineNo);
      std::operator+(&local_108,&local_128,", ");
      peVar3 = std::
               __shared_ptr_access<nigel::CompileNotification,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->(local_a8);
      peVar5 = std::__shared_ptr_access<nigel::Token,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<nigel::Token,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&peVar3->token);
      std::__cxx11::to_string(&local_148,peVar5->columnNo);
      std::operator+(&local_e8,&local_108,&local_148);
      std::__cxx11::string::operator+=(local_58,(string *)&local_e8);
      std::__cxx11::string::~string((string *)&local_e8);
      std::__cxx11::string::~string((string *)&local_148);
      std::__cxx11::string::~string((string *)&local_108);
      std::__cxx11::string::~string((string *)&local_128);
    }
    else {
      peVar3 = std::
               __shared_ptr_access<nigel::CompileNotification,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->(local_a8);
      if (peVar3->line != 0xffffffffffffffff) {
        peVar3 = std::
                 __shared_ptr_access<nigel::CompileNotification,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->(local_a8);
        std::__cxx11::to_string(&local_168,peVar3->line);
        std::__cxx11::string::operator+=(local_58,(string *)&local_168);
        std::__cxx11::string::~string((string *)&local_168);
      }
    }
    std::__cxx11::string::operator+=(local_58,"): ");
    peVar3 = std::
             __shared_ptr_access<nigel::CompileNotification,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->(local_a8);
    if (((int)peVar3->type < 1) ||
       (peVar3 = std::
                 __shared_ptr_access<nigel::CompileNotification,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->(local_a8), 0x7ffe < (int)peVar3->type)) {
      peVar3 = std::
               __shared_ptr_access<nigel::CompileNotification,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->(local_a8);
      if (((int)peVar3->type < 0x8000) ||
         (peVar3 = std::
                   __shared_ptr_access<nigel::CompileNotification,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->(local_a8), 0xfffe < (int)peVar3->type)) {
        peVar3 = std::
                 __shared_ptr_access<nigel::CompileNotification,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->(local_a8);
        if ((0xffff < (int)peVar3->type) &&
           (peVar3 = std::
                     __shared_ptr_access<nigel::CompileNotification,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->(local_a8), (int)peVar3->type < 0x10002)) {
          std::__cxx11::string::operator+=(local_58,"notification");
          outStr.field_2._8_8_ = outStr.field_2._8_8_ + 1;
        }
      }
      else {
        std::__cxx11::string::operator+=(local_58,"warning");
        notificationCount = notificationCount + 1;
      }
    }
    else {
      std::__cxx11::string::operator+=(local_58,"error");
      warningCount = warningCount + 1;
    }
    peVar3 = std::
             __shared_ptr_access<nigel::CompileNotification,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->(local_a8);
    __val = CompileNotification::getCode(peVar3);
    std::__cxx11::to_string(&local_208,__val);
    std::operator+(&local_1e8," ",&local_208);
    std::operator+(&local_1c8,&local_1e8," \"");
    peVar3 = std::
             __shared_ptr_access<nigel::CompileNotification,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->(local_a8);
    __rhs = std::
            map<nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<nigel::CompileNotification::Type>,_std::allocator<std::pair<const_nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](&this->notificationTexts,&peVar3->type);
    std::operator+(&local_1a8,&local_1c8,__rhs);
    std::operator+(&local_188,&local_1a8,"\"");
    std::__cxx11::string::operator+=(local_58,(string *)&local_188);
    std::__cxx11::string::~string((string *)&local_188);
    std::__cxx11::string::~string((string *)&local_1a8);
    std::__cxx11::string::~string((string *)&local_1c8);
    std::__cxx11::string::~string((string *)&local_1e8);
    std::__cxx11::string::~string((string *)&local_208);
    peVar3 = std::
             __shared_ptr_access<nigel::CompileNotification,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->(local_a8);
    bVar2 = std::operator!=(&peVar3->token,(nullptr_t)0x0);
    if (bVar2) {
      peVar3 = std::
               __shared_ptr_access<nigel::CompileNotification,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->(local_a8);
      peVar5 = std::__shared_ptr_access<nigel::Token,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<nigel::Token,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&peVar3->token);
      (*peVar5->_vptr_Token[2])(&pos,peVar5,0);
      std::operator+(&local_248," at token \'",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&pos);
      std::operator+(&local_228,&local_248,"\'");
      std::__cxx11::string::operator+=(local_58,(string *)&local_228);
      std::__cxx11::string::~string((string *)&local_228);
      std::__cxx11::string::~string((string *)&local_248);
      std::__cxx11::string::~string((string *)&pos);
    }
    peVar3 = std::
             __shared_ptr_access<nigel::CompileNotification,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->(local_a8);
    bVar2 = std::operator!=(&peVar3->lineText,(nullptr_t)0x0);
    if (bVar2) {
      std::__cxx11::string::operator+=(local_58,": \n");
      peVar3 = std::
               __shared_ptr_access<nigel::CompileNotification,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->(local_a8);
      peVar4 = std::
               __shared_ptr_access<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator*((__shared_ptr_access<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)&peVar3->lineText);
      std::__cxx11::string::operator+=(local_58,(string *)peVar4);
    }
    peVar3 = std::
             __shared_ptr_access<nigel::CompileNotification,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->(local_a8);
    bVar2 = std::operator!=(&peVar3->token,(nullptr_t)0x0);
    __x = extraout_XMM0_Qa;
    if (bVar2) {
      peVar3 = std::
               __shared_ptr_access<nigel::CompileNotification,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->(local_a8);
      peVar5 = std::__shared_ptr_access<nigel::Token,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<nigel::Token,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&peVar3->token);
      local_270 = peVar5->columnNo;
      peVar3 = std::
               __shared_ptr_access<nigel::CompileNotification,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->(local_a8);
      peVar5 = std::__shared_ptr_access<nigel::Token,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<nigel::Token,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&peVar3->token);
      (*peVar5->_vptr_Token[2])(&i,peVar5,0);
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &i,"_!EOF!_");
      std::__cxx11::string::~string((string *)&i);
      if (bVar2) {
        peVar3 = std::
                 __shared_ptr_access<nigel::CompileNotification,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->(local_a8);
        std::
        __shared_ptr_access<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
        ::operator->((__shared_ptr_access<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)&peVar3->lineText);
        lVar6 = std::__cxx11::string::size();
        local_270 = lVar6 + 1;
      }
      for (local_298 = 1; local_298 < local_270; local_298 = local_298 + 1) {
        std::__cxx11::string::operator+=(local_58,' ');
      }
      std::__cxx11::string::operator+=(local_58,'^');
      peVar3 = std::
               __shared_ptr_access<nigel::CompileNotification,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->(local_a8);
      peVar5 = std::__shared_ptr_access<nigel::Token,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<nigel::Token,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&peVar3->token);
      i_1._7_1_ = 0;
      (*peVar5->_vptr_Token[2])(&local_2b8,peVar5,0);
      bVar2 = std::operator!=(&local_2b8,"-!-UNKNOWN-!-");
      local_70b = false;
      if (bVar2) {
        peVar3 = std::
                 __shared_ptr_access<nigel::CompileNotification,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->(local_a8);
        peVar5 = std::__shared_ptr_access<nigel::Token,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<nigel::Token,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&peVar3->token);
        (*peVar5->_vptr_Token[2])(&local_2d8,peVar5,0);
        i_1._7_1_ = 1;
        local_70b = std::operator!=(&local_2d8,"_!EOF!_");
      }
      if ((i_1._7_1_ & 1) != 0) {
        std::__cxx11::string::~string((string *)&local_2d8);
      }
      __x = (double)std::__cxx11::string::~string((string *)&local_2b8);
      if (local_70b != false) {
        local_2e8 = 1;
        while( true ) {
          uVar1 = local_2e8;
          peVar3 = std::
                   __shared_ptr_access<nigel::CompileNotification,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->(local_a8);
          peVar5 = std::__shared_ptr_access<nigel::Token,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<nigel::Token,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)&peVar3->token);
          (*peVar5->_vptr_Token[2])(local_308,peVar5,0);
          uVar7 = std::__cxx11::string::size();
          __x = (double)std::__cxx11::string::~string(local_308);
          if (uVar7 <= uVar1) break;
          std::__cxx11::string::operator+=(local_58,'~');
          local_2e8 = local_2e8 + 1;
        }
      }
    }
    helper::log((helper *)local_58,__x);
    std::_List_iterator<std::shared_ptr<nigel::CompileNotification>_>::operator++(&__end1);
  }
  if (warningCount == 0) {
    if ((notificationCount == 0) && (outStr.field_2._8_8_ == 0)) {
      rVar9 = std::chrono::duration<double,_std::ratio<1L,_1L>_>::count(&local_80);
      std::__cxx11::to_string(&local_6c8,rVar9);
      std::operator+(&local_6a8,"Successfully finished in ",&local_6c8);
      std::operator+(&local_688,&local_6a8," seconds. ");
      helper::log((helper *)&local_688,__x_02);
      std::__cxx11::string::~string((string *)&local_688);
      std::__cxx11::string::~string((string *)&local_6a8);
      std::__cxx11::string::~string((string *)&local_6c8);
    }
    else {
      std::__cxx11::to_string(&local_608,0);
      std::operator+(&local_5e8,"Finshed with ",&local_608);
      std::operator+(&local_5c8,&local_5e8," errors, ");
      std::__cxx11::to_string(&local_628,notificationCount);
      std::operator+(&local_5a8,&local_5c8,&local_628);
      pcVar8 = " warnings";
      if (notificationCount == 1) {
        pcVar8 = " warning";
      }
      std::operator+(&local_588,&local_5a8,pcVar8);
      std::operator+(&local_568,&local_588," and ");
      std::__cxx11::to_string(&local_648,outStr.field_2._8_8_);
      std::operator+(&local_548,&local_568,&local_648);
      pcVar8 = " improvements";
      if (notificationCount == 1) {
        pcVar8 = " improvement";
      }
      std::operator+(&local_528,&local_548,pcVar8);
      std::operator+(&local_508,&local_528," in ");
      rVar9 = std::chrono::duration<double,_std::ratio<1L,_1L>_>::count(&local_80);
      std::__cxx11::to_string(&local_668,rVar9);
      std::operator+(&local_4e8,&local_508,&local_668);
      std::operator+(&local_4c8,&local_4e8," seconds.");
      helper::log((helper *)&local_4c8,__x_01);
      std::__cxx11::string::~string((string *)&local_4c8);
      std::__cxx11::string::~string((string *)&local_4e8);
      std::__cxx11::string::~string((string *)&local_668);
      std::__cxx11::string::~string((string *)&local_508);
      std::__cxx11::string::~string((string *)&local_528);
      std::__cxx11::string::~string((string *)&local_548);
      std::__cxx11::string::~string((string *)&local_648);
      std::__cxx11::string::~string((string *)&local_568);
      std::__cxx11::string::~string((string *)&local_588);
      std::__cxx11::string::~string((string *)&local_5a8);
      std::__cxx11::string::~string((string *)&local_628);
      std::__cxx11::string::~string((string *)&local_5c8);
      std::__cxx11::string::~string((string *)&local_5e8);
      std::__cxx11::string::~string((string *)&local_608);
    }
  }
  else {
    std::__cxx11::to_string(&local_448,warningCount);
    std::operator+(&local_428,"FAILED ",&local_448);
    pcVar8 = " ERROR";
    if (1 < warningCount) {
      pcVar8 = " ERRORS";
    }
    std::operator+(&local_408,&local_428,pcVar8);
    std::operator+(&local_3e8,&local_408," OCCURRED! ");
    std::__cxx11::to_string(&local_468,notificationCount);
    std::operator+(&local_3c8,&local_3e8,&local_468);
    std::operator+(&local_3a8,&local_3c8," warnings occurred. ");
    std::__cxx11::to_string(&local_488,outStr.field_2._8_8_);
    std::operator+(&local_388,&local_3a8,&local_488);
    std::operator+(&local_368,&local_388," improvements available. Took ");
    rVar9 = std::chrono::duration<double,_std::ratio<1L,_1L>_>::count(&local_80);
    std::__cxx11::to_string(&local_4a8,rVar9);
    std::operator+(&local_348,&local_368,&local_4a8);
    std::operator+(&local_328,&local_348," second");
    helper::log((helper *)&local_328,__x_00);
    std::__cxx11::string::~string((string *)&local_328);
    std::__cxx11::string::~string((string *)&local_348);
    std::__cxx11::string::~string((string *)&local_4a8);
    std::__cxx11::string::~string((string *)&local_368);
    std::__cxx11::string::~string((string *)&local_388);
    std::__cxx11::string::~string((string *)&local_488);
    std::__cxx11::string::~string((string *)&local_3a8);
    std::__cxx11::string::~string((string *)&local_3c8);
    std::__cxx11::string::~string((string *)&local_468);
    std::__cxx11::string::~string((string *)&local_3e8);
    std::__cxx11::string::~string((string *)&local_408);
    std::__cxx11::string::~string((string *)&local_428);
    std::__cxx11::string::~string((string *)&local_448);
  }
  std::__cxx11::string::~string(local_58);
  return;
}

Assistant:

void BuilderTask::printErrorLog( std::list<std::shared_ptr<CompileNotification>> notificationList, std::chrono::time_point<std::chrono::system_clock> startTime )
	{
		size_t errorCount = 0, warningCount = 0, notificationCount = 0;
		String outStr = "";
		LogLevel level = LogLevel::Information;

		std::chrono::time_point<std::chrono::system_clock> endTime = std::chrono::system_clock::now();
		std::chrono::duration<double> duration = ( endTime - startTime );

		for( auto &n : notificationList )
		{
			outStr = n->file->generic_string() + "(";
			if( n->token != nullptr ) outStr += to_string( n->token->lineNo ) + ", " + to_string( n->token->columnNo );
			else if( n->line != -1 ) outStr += to_string( n->line );
			outStr += "): ";

			if( n->type > NT::begin_err && n->type < NT::begin_warning )
			{//error
				outStr += "error";
				level = LogLevel::Error;
				errorCount++;
			}
			else if( n->type > NT::begin_warning && n->type < NT::begin_improvements )
			{//warning
				outStr += "warning";
				level = LogLevel::Warning;
				warningCount++;
			}
			else if( n->type > NT::begin_improvements && n->type < NT::count )
			{//notification
				outStr += "notification";
				level = LogLevel::Information;
				notificationCount++;
			}

			outStr += " " + to_string( n->getCode() ) + " \"" + notificationTexts[n->type] + "\"" ;
			if( n->token != nullptr ) outStr += " at token '" + n->token->toString() + "'";
			if( n->lineText != nullptr )
			{
				outStr += ": \n";
				outStr += *n->lineText;
			}

			if( n->token != nullptr )
			{
				size_t pos = n->token->columnNo;
				if( n->token->toString() == "_!EOF!_" ) pos = n->lineText->size() + 1;

				for( size_t i = 1 ; i < pos ; i++ ) outStr += ' ';

				outStr += '^';
				if( n->token->toString() != "-!-UNKNOWN-!-" &&
					n->token->toString() != "_!EOF!_" ) 
					for( size_t i = 1 ; i < n->token->toString().size() ; i++ ) outStr += '~';
			}

			log( outStr, level );
		}
		if( errorCount > 0 )
		{
			log( "FAILED " + to_string( errorCount ) + ( errorCount > 1 ? " ERRORS" : " ERROR" ) + " OCCURRED! " + to_string( warningCount ) + " warnings occurred. " + to_string( notificationCount ) + " improvements available. Took " + to_string( duration.count() ) + " second" );
		}
		else if( warningCount > 0 || notificationCount > 0 )
		{
			log( "Finshed with " + to_string( errorCount ) + " errors, " + to_string( warningCount ) + ( warningCount == 1 ? " warning" : " warnings" ) + " and " + to_string( notificationCount ) + ( warningCount == 1 ? " improvement" : " improvements" ) + " in " + to_string( duration.count() ) + " seconds." );
		}
		else log( "Successfully finished in " + to_string( duration.count() ) + " seconds. " );
	}